

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O0

void __thiscall mjs::gc_heap::garbage_collect(gc_heap *this)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  gc_heap_ptr_untyped **ppgVar4;
  reference ppuVar5;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *this_00;
  reference ppuVar6;
  slot *psVar7;
  uint32_t uStack_74;
  slot_allocation_header a;
  uint **p_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *__range2;
  value_type ppos;
  allocation_context new_ac;
  gc_heap_ptr_untyped *p;
  gc_heap_ptr_untyped **__end1;
  gc_heap_ptr_untyped **__begin1;
  pointer_set *__range1;
  gc_heap *this_local;
  
  bVar2 = gc_state::initial_state(&this->gc_state_);
  if (!bVar2) {
    __assert_fail("gc_state_.initial_state()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                  ,0x27,"void mjs::gc_heap::garbage_collect()");
  }
  __end1 = pointer_set::begin(&this->pointers_);
  ppgVar4 = pointer_set::end(&this->pointers_);
  for (; __end1 != ppgVar4; __end1 = __end1 + 1) {
    new_ac._16_8_ = *__end1;
    bVar2 = allocation_context::is_internal(&this->alloc_context_,(void *)new_ac._16_8_);
    if (!bVar2) {
      register_fixup(this,(uint32_t *)(new_ac._16_8_ + 8));
    }
  }
  bVar2 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::empty
                    (&(this->gc_state_).pending_fixups);
  if (bVar2) {
    allocation_context::run_destructors(&this->alloc_context_);
  }
  else {
    allocation_context::other_half((allocation_context *)&ppos,&this->alloc_context_);
    (this->gc_state_).new_context = (allocation_context *)&ppos;
    (this->gc_state_).level = 0;
    while( true ) {
      bVar2 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::empty
                        (&(this->gc_state_).pending_fixups);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppuVar5 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::back
                          (&(this->gc_state_).pending_fixups);
      puVar1 = *ppuVar5;
      std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::pop_back
                (&(this->gc_state_).pending_fixups);
      uVar3 = gc_move(this,*puVar1);
      *puVar1 = uVar3;
    }
    this_00 = &(this->gc_state_).weak_fixups;
    __end2 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::begin(this_00);
    p_1 = (uint **)std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<unsigned_int_**,_std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>
                                  *)&p_1);
      if (!bVar2) break;
      ppuVar6 = __gnu_cxx::
                __normal_iterator<unsigned_int_**,_std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>
                ::operator*(&__end2);
      bVar2 = allocation_context::pos_inside(&this->alloc_context_,**ppuVar6 - 1);
      if (!bVar2) {
        __assert_fail("alloc_context_.pos_inside(*p - 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                      ,0x40,"void mjs::gc_heap::garbage_collect()");
      }
      psVar7 = allocation_context::get_at(&this->alloc_context_,**ppuVar6 - 1);
      uStack_74 = (psVar7->allocation).type;
      if (uStack_74 == 0xfffffffe) {
        psVar7 = allocation_context::get_at(&this->alloc_context_,**ppuVar6);
        **ppuVar6 = psVar7->new_position;
      }
      else {
        **ppuVar6 = 0;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_**,_std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::clear
              (&(this->gc_state_).weak_fixups);
    std::swap<mjs::gc_heap::allocation_context>(&this->alloc_context_,(allocation_context *)&ppos);
    allocation_context::run_destructors((allocation_context *)&ppos);
    (this->gc_state_).new_context = (allocation_context *)0x0;
  }
  bVar2 = gc_state::initial_state(&this->gc_state_);
  if (!bVar2) {
    __assert_fail("gc_state_.initial_state()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                  ,0x51,"void mjs::gc_heap::garbage_collect()");
  }
  return;
}

Assistant:

void gc_heap::garbage_collect() {
    assert(gc_state_.initial_state());

    // Determine roots and add their positions as pending fixups
    // TODO: Used to move the roots lower in the pointers_ array (since we know they won't be destroyed this time around). That still might be an optimization.
    for (auto p: pointers_) {
        if (!alloc_context_.is_internal(p)) {
            register_fixup(p->pos_);
        }
    }

    if (!gc_state_.pending_fixups.empty()) {
        allocation_context new_ac = alloc_context_.other_half();

        gc_state_.new_context = &new_ac;
        gc_state_.level = 0;

        // Keep going while there are still fixups to be processed (note: the array changes between loop iterations)
        while (!gc_state_.pending_fixups.empty()) {
            auto ppos = gc_state_.pending_fixups.back();
            gc_state_.pending_fixups.pop_back();
            *ppos = gc_move(*ppos);
        }

        // Handle weak pointers - if they moved update, otherwise invalidate
        for (auto& p: gc_state_.weak_fixups) {
            assert(alloc_context_.pos_inside(*p - 1));
            auto a = alloc_context_.get_at(*p - 1)->allocation;
            if (a.type == gc_moved_type_index) {
                *p = alloc_context_.get_at(*p)->new_position;
            } else {
                *p = 0;
            }
        }
        gc_state_.weak_fixups.clear();

        std::swap(alloc_context_, new_ac);
        new_ac.run_destructors();
        gc_state_.new_context = nullptr;
    } else {
        alloc_context_.run_destructors();
    }

    assert(gc_state_.initial_state());
}